

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

Am_Value Am_Get_Input_From_Dialog
                   (Am_Value_List *prompt_texts,Am_String *initial_value,int x,int y,bool modal)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Method_Wrapper *pAVar3;
  Am_Object *this;
  undefined4 in_register_00000014;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  undefined3 in_register_00000081;
  byte in_R9B;
  Am_Value AVar4;
  Am_Object local_b8;
  Am_Object local_b0;
  undefined1 local_a1;
  Am_Value local_a0;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object text_widget;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Object local_58 [3];
  Am_Object local_40;
  Am_Object the_dialog;
  char *initial_string;
  bool modal_local;
  int y_local;
  int x_local;
  Am_String *initial_value_local;
  Am_Value_List *prompt_texts_local;
  Am_Value *v;
  
  bVar1 = Am_String::Valid((Am_String *)CONCAT44(in_register_00000014,x));
  if (bVar1) {
    the_dialog.data =
         (Am_Object_Data *)
         Am_String::operator_cast_to_char_((Am_String *)CONCAT44(in_register_00000014,x));
  }
  else {
    the_dialog.data = (Am_Object_Data *)0x38e0d4;
  }
  Am_Object::Am_Object(&local_40);
  bVar1 = Am_Value_List::Empty(&cached_text_input_dialogs);
  if (bVar1) {
    Am_Object::Create(local_58,(char *)&Am_Text_Input_Dialog);
    Am_Object::operator=(&local_40,local_58);
    Am_Object::~Am_Object(local_58);
  }
  else {
    Am_Value_List::Pop(&local_68,true);
    Am_Object::operator=(&local_40,(Am_Value *)&local_68);
    Am_Value::~Am_Value((Am_Value *)&local_68);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)initial_value);
  Am_Object::Set(&local_40,0xa2,pAVar2,0);
  Am_Object::Get_Object(&local_70,(Am_Slot_Key)&local_40,0xc5);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_stop_waiting_for_dialog);
  this = Am_Object::Set(&local_70,0xca,pAVar3,0);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_abort_waiting_for_dialog);
  Am_Object::Set(this,0xc9,pAVar3,0);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Set(&local_40,0x169,(char *)the_dialog.data,0);
  Am_Object::Am_Object(&text_widget,&local_40);
  Am_Object::Add_Part(&Am_Screen,&text_widget,true,0);
  Am_Object::~Am_Object(&text_widget);
  set_dialog_position(&local_40,y,CONCAT31(in_register_00000081,modal));
  Am_Object::Get_Object(&local_88,(Am_Slot_Key)&local_40,0x1ec);
  Am_Object::Get_Object(&local_80,(Am_Slot_Key)&local_88,0x1eb);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Am_Object(&local_90,&local_80);
  Am_Value::Am_Value(&local_a0,(char *)the_dialog.data);
  Am_Start_Widget(&local_90,&local_a0);
  Am_Value::~Am_Value(&local_a0);
  Am_Object::~Am_Object(&local_90);
  local_a1 = 0;
  Am_Value::Am_Value((Am_Value *)prompt_texts);
  Am_Object::Am_Object(&local_b0,&local_40);
  Am_Pop_Up_Window_And_Wait(&local_b0,(Am_Value *)prompt_texts,(bool)(in_R9B & 1));
  Am_Object::~Am_Object(&local_b0);
  Am_Object::Am_Object(&local_b8,&local_40);
  Am_Object::Remove_Part(&Am_Screen,&local_b8);
  Am_Object::~Am_Object(&local_b8);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_40);
  Am_Value_List::Push(&cached_text_input_dialogs,pAVar2,true);
  local_a1 = 1;
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_40);
  AVar4.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar4._0_8_ = prompt_texts;
  return AVar4;
}

Assistant:

Am_Value
Am_Get_Input_From_Dialog(Am_Value_List prompt_texts,
                         Am_String initial_value /*= ""*/,
                         int x /*= Am_AT_CENTER_SCREEN */,
                         int y /* = Am_AT_CENTER_SCREEN */,
                         bool modal /*=false*/)
{
  const char *initial_string;
  if (initial_value.Valid())
    initial_string = initial_value;
  else
    initial_string = "";
  Am_Object the_dialog;
  if (cached_text_input_dialogs.Empty())
    the_dialog = Am_Text_Input_Dialog.Create();
  else {
    the_dialog = cached_text_input_dialogs.Pop();
  }
  the_dialog.Set(Am_ITEMS, prompt_texts);
  the_dialog.Get_Object(Am_COMMAND)
      .Set(Am_DO_METHOD, do_stop_waiting_for_dialog)
      .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog);
  the_dialog.Set(Am_VALUE, initial_string);
  Am_Screen.Add_Part(the_dialog);
  set_dialog_position(the_dialog, x, y);
  Am_Object text_widget =
      the_dialog.Get_Object(Am_DIALOG_GROUP).Get_Object(Am_TEXT_WIDGET);
  Am_Start_Widget(text_widget, initial_string);
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(the_dialog, v, modal);
  Am_Screen.Remove_Part(the_dialog);
  cached_text_input_dialogs.Push(the_dialog);
  return v;
}